

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  ushort uVar1;
  int iVar2;
  uchar *puVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  unsigned_short *__ptr;
  HuffmanTree *pHVar8;
  ulong uVar9;
  unsigned_short *puVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  HuffmanTree *pHVar15;
  HuffmanTree *pHVar16;
  uint *puVar17;
  HuffmanTree *pHVar18;
  long lVar19;
  HuffmanTree *pHVar20;
  uint *puVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  HuffmanTree tree_ll;
  LodePNGBitReader local_168;
  HuffmanTree *local_140;
  HuffmanTree *local_138;
  HuffmanTree *local_130;
  HuffmanTree *local_128;
  unsigned_short *local_120;
  HuffmanTree *local_118;
  uint local_110;
  uint local_10c;
  HuffmanTree *local_108;
  uint local_fc;
  ulong local_f8;
  uint local_ec;
  long local_e8;
  ulong local_e0;
  unsigned_short *local_d8;
  uchar **local_d0;
  ulong *local_c8;
  LodePNGDecompressSettings *local_c0;
  HuffmanTree local_b8;
  HuffmanTree local_88;
  HuffmanTree local_58;
  
  __ptr = (unsigned_short *)*out;
  local_128 = (HuffmanTree *)*outsize;
  local_168.bitsize = insize * 8;
  uVar6 = 0x69;
  local_d0 = out;
  local_c8 = outsize;
  if (local_168.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_168.bp = 0;
    local_168.buffer = 0;
    local_140 = (HuffmanTree *)0x0;
    uVar5 = 0;
    local_168.data = in;
    local_168.size = insize;
    local_118 = local_128;
    local_c0 = settings;
    do {
      if (uVar5 != 0) {
        uVar6 = 0;
        break;
      }
      uVar5 = ensureBits9(&local_168,(size_t)outsize);
      pHVar18 = local_140;
      sVar4 = local_168.size;
      puVar3 = local_168.data;
      uVar6 = 0x34;
      if (uVar5 == 0) break;
      uVar14 = local_168.buffer >> 3;
      uVar23 = local_168.bp + 3;
      uVar5 = local_168.buffer >> 1 & 3;
      if (uVar5 == 0) {
        uVar22 = local_168.bp + 10 >> 3;
        pHVar18 = (HuffmanTree *)(uVar22 + 4);
        if (local_168.size <= pHVar18) break;
        uVar1 = *(ushort *)((long)(uint **)local_168.data + uVar22);
        uVar9 = (ulong)uVar1;
        if ((local_c0->ignore_nlen == 0) &&
           ((uint)*(ushort *)((long)(uint **)local_168.data + uVar22 + 2) + (uint)uVar1 != 0xffff))
        {
          uVar6 = 0x15;
          break;
        }
        pHVar8 = (HuffmanTree *)((long)&local_140->codes + uVar9);
        uVar5 = local_168.buffer;
        local_168.bp = uVar23;
        if (local_118 < pHVar8) {
          pHVar15 = (HuffmanTree *)((ulong)((long)pHVar8 * 3) >> 1);
          if ((HuffmanTree *)((long)local_118 * 2) < pHVar8) {
            pHVar15 = pHVar8;
          }
          local_10c = local_168.buffer;
          outsize = (size_t *)pHVar15;
          local_168.buffer = uVar14;
          local_120 = __ptr;
          __ptr = (unsigned_short *)realloc(__ptr,(size_t)pHVar15);
          uVar5 = local_10c;
          uVar14 = local_168.buffer;
          local_118 = pHVar15;
          if (__ptr == (unsigned_short *)0x0) {
            uVar6 = 0x53;
            __ptr = local_120;
            break;
          }
        }
        local_168.buffer = uVar14;
        pHVar15 = (HuffmanTree *)((long)&pHVar18->codes + uVar9);
        if (sVar4 < pHVar15) {
          uVar6 = 0x17;
          local_128 = pHVar8;
          break;
        }
        if (uVar1 != 0) {
          outsize = (size_t *)((long)&pHVar18->codes + (long)(uint **)puVar3);
          memcpy((uchar *)((long)&local_140->codes + (long)__ptr),outsize,uVar9);
        }
        local_168.bp = (long)pHVar15 * 8;
        uVar6 = 0;
        local_140 = pHVar8;
        local_128 = pHVar8;
      }
      else {
        if (uVar5 == 3) {
          uVar6 = 0x14;
          break;
        }
        local_88.codes = (uint *)0x0;
        local_88.lengths = (uint *)0x0;
        local_88.table_len = (uchar *)0x0;
        local_88.table_value = (unsigned_short *)0x0;
        local_b8.codes = (uint *)0x0;
        local_b8.lengths = (uint *)0x0;
        local_b8.table_len = (uchar *)0x0;
        local_b8.table_value = (unsigned_short *)0x0;
        local_10c = local_168.buffer;
        if (uVar5 == 1) {
          local_168.bp = uVar23;
          local_168.buffer = uVar14;
          generateFixedLitLenTree(&local_88);
          generateFixedDistanceTree(&local_b8);
          uVar6 = 0;
          uVar23 = local_168.bp;
        }
        else {
          pHVar8 = (HuffmanTree *)(uVar23 >> 3);
          outsize = (size_t *)((long)&pHVar8->codes + 2);
          if (outsize < local_168.size) {
            uVar1 = *(ushort *)((long)&pHVar8->codes + (long)(uint **)local_168.data);
            outsize = (size_t *)(ulong)uVar1;
            uVar22 = (ulong)(uint3)(CONCAT12(((undefined1 *)((long)(uint **)local_168.data + 2))
                                             [(long)pHVar8],uVar1) >> ((byte)uVar23 & 7));
          }
          else {
            local_168.buffer = 0;
            if (pHVar8 < local_168.size) {
              local_168.buffer =
                   (uint)*(byte *)((long)&pHVar8->codes + (long)(uint **)local_168.data);
              outsize = (size_t *)local_168.data;
            }
            pHVar8 = (HuffmanTree *)((long)&pHVar8->codes + 1);
            if (pHVar8 < local_168.size) {
              local_168.buffer =
                   local_168.buffer |
                   (uint)*(byte *)((long)&pHVar8->codes + (long)(uint **)local_168.data) << 8;
            }
            local_168.buffer = local_168.buffer >> ((byte)uVar23 & 7);
            uVar22 = (ulong)local_168.buffer;
            uVar6 = 0x31;
            if (local_168.bitsize <= local_168.bp + 0x11) goto LAB_0010e1e8;
          }
          uVar23 = local_168.bp + 0x11;
          local_168.buffer = (uint)(uVar22 >> 0xe);
          local_168.bp = uVar23;
          pHVar8 = (HuffmanTree *)malloc(0x4c);
          if (pHVar8 == (HuffmanTree *)0x0) {
            uVar6 = 0x53;
            uVar23 = local_168.bp;
          }
          else {
            uVar6 = (uint)(uVar22 >> 10) & 0xf;
            uVar25 = (ulong)uVar6;
            uVar6 = uVar6 + 4;
            local_58.codes = (uint *)0x0;
            local_58.lengths = (uint *)0x0;
            local_58.table_len = (uchar *)0x0;
            local_58.table_value = (unsigned_short *)0x0;
            uVar9 = uVar6 * 3 + uVar23;
            if ((uVar9 < uVar23) || (local_168.bitsize < uVar9)) {
              pHVar20 = (HuffmanTree *)0x0;
              pHVar15 = (HuffmanTree *)0x0;
              uVar6 = 0x32;
            }
            else {
              local_fc = (uint)uVar22 & 0x1f;
              local_f8 = (ulong)local_fc;
              local_fc = local_fc + 0x101;
              local_108 = (HuffmanTree *)(ulong)(((uint)uVar22 >> 5 & 0x1f) + 1);
              lVar19 = 0;
              local_138 = (HuffmanTree *)(ulong)uVar6;
              local_120 = __ptr;
              do {
                ensureBits9(&local_168,(size_t)pHVar8);
                uVar6 = local_168.buffer & 7;
                local_168.buffer = local_168.buffer >> 3;
                uVar23 = local_168.bp + 3;
                *(uint *)((long)&pHVar8->codes + (ulong)*(uint *)((long)CLCL_ORDER + lVar19) * 4) =
                     uVar6;
                lVar19 = lVar19 + 4;
                local_168.bp = uVar23;
              } while (uVar25 * 4 + 0x10 != lVar19);
              if ((int)local_138 != 0x13) {
                do {
                  *(uint *)((long)&pHVar8->codes + (ulong)CLCL_ORDER[uVar25 + 4] * 4) = 0;
                  uVar25 = uVar25 + 1;
                } while (uVar25 != 0xf);
              }
              uVar6 = HuffmanTree_makeFromLengths(&local_58,(uint *)pHVar8,0x13,7);
              __ptr = local_120;
              pHVar18 = local_140;
              if (uVar6 == 0) {
                pHVar20 = (HuffmanTree *)malloc(0x480);
                pHVar15 = (HuffmanTree *)malloc(0x80);
                if (pHVar15 == (HuffmanTree *)0x0 || pHVar20 == (HuffmanTree *)0x0) {
                  uVar6 = 0x53;
                }
                else {
                  uVar14 = 0;
                  local_138 = pHVar15;
                  local_130 = pHVar20;
                  memset(pHVar20,0,0x480);
                  local_138->codes = (uint *)0x0;
                  local_138->lengths = (uint *)0x0;
                  local_138->maxbitlen = 0;
                  local_138->numcodes = 0;
                  local_138->table_len = (uchar *)0x0;
                  local_138->table_value = (unsigned_short *)0x0;
                  local_138[1].codes = (uint *)0x0;
                  local_138[1].lengths = (uint *)0x0;
                  local_138[1].maxbitlen = 0;
                  local_138[1].numcodes = 0;
                  local_138[1].table_len = (uchar *)0x0;
                  local_138[1].table_value = (unsigned_short *)0x0;
                  local_138[2].codes = (uint *)0x0;
                  local_138[2].lengths = (uint *)0x0;
                  local_138[2].maxbitlen = 0;
                  local_138[2].numcodes = 0;
                  local_138[2].table_len = (uchar *)0x0;
                  local_138[2].table_value = (unsigned_short *)0x0;
                  local_138[3].codes = (uint *)0x0;
                  uVar5 = (int)local_108 + local_fc;
                  uVar22 = (ulong)uVar5;
                  local_108 = (HuffmanTree *)local_58.table_len;
                  local_d8 = local_58.table_value;
                  local_ec = (int)local_f8 + 0x102;
                  local_e0 = (ulong)local_fc;
                  uVar6 = -(int)local_f8;
                  local_f8 = (ulong)uVar6;
                  local_e8 = (long)(int)uVar6 + -0x101;
                  local_110 = 0;
                  do {
                    pHVar15 = (HuffmanTree *)(uVar23 >> 3);
                    if ((HuffmanTree *)((long)&pHVar15->codes + 3U) < local_168.size) {
                      local_168.buffer =
                           *(uint *)((long)&pHVar15->codes + (long)(uint **)local_168.data);
                    }
                    else {
                      local_168.buffer = 0;
                      if (pHVar15 < local_168.size) {
                        local_168.buffer =
                             (uint)*(byte *)((long)&pHVar15->codes + (long)(uint **)local_168.data);
                      }
                      pHVar20 = (HuffmanTree *)((long)&pHVar15->codes + 1);
                      if (pHVar20 < local_168.size) {
                        local_168.buffer =
                             local_168.buffer |
                             (uint)*(byte *)((long)&pHVar20->codes + (long)(uint **)local_168.data)
                             << 8;
                      }
                      pHVar15 = (HuffmanTree *)((long)&pHVar15->codes + 2);
                      if (pHVar15 < local_168.size) {
                        local_168.buffer =
                             local_168.buffer |
                             (uint)*(byte *)((long)&pHVar15->codes + (long)(uint **)local_168.data)
                             << 0x10;
                      }
                    }
                    local_168.buffer = local_168.buffer >> ((byte)uVar23 & 7);
                    uVar6 = huffmanDecodeSymbol(&local_168,local_108);
                    __ptr = local_120;
                    pHVar20 = local_130;
                    pHVar15 = local_138;
                    if (uVar6 < 0x10) {
                      pHVar16 = local_138;
                      uVar12 = local_fc;
                      if (uVar14 < local_fc) {
                        uVar12 = 0;
                        pHVar16 = local_130;
                      }
                      *(uint *)((long)&pHVar16->codes + (ulong)(uVar14 - uVar12) * 4) = uVar6;
                      uVar14 = uVar14 + 1;
                    }
                    else {
                      iVar2 = (int)local_e8;
                      if (uVar6 == 0x12) {
                        uVar6 = local_168.buffer & 0x7f;
                        local_168.buffer = local_168.buffer >> 7;
                        local_168.bp = local_168.bp + 7;
                        uVar23 = (ulong)uVar14;
                        iVar24 = -uVar14;
                        puVar17 = (uint *)((long)&local_130->codes + uVar23 * 4);
                        iVar7 = uVar6 + 0xb;
                        do {
                          if (uVar22 <= uVar23) {
                            uVar14 = -iVar24;
                            local_110 = 0xf;
                            goto LAB_0010e907;
                          }
                          puVar21 = (uint *)((long)&local_138->codes +
                                            (ulong)(uint)(iVar2 + (int)uVar23) * 4);
                          if (uVar23 < local_e0) {
                            puVar21 = puVar17;
                          }
                          *puVar21 = 0;
                          uVar23 = uVar23 + 1;
                          iVar24 = iVar24 + -1;
                          puVar17 = puVar17 + 1;
                          iVar7 = iVar7 + -1;
                        } while (iVar7 != 0);
                      }
                      else if (uVar6 == 0x11) {
                        uVar6 = local_168.buffer & 7;
                        local_168.buffer = local_168.buffer >> 3;
                        local_168.bp = local_168.bp + 3;
                        uVar23 = (ulong)uVar14;
                        iVar24 = -uVar14;
                        puVar17 = (uint *)((long)&local_130->codes + uVar23 * 4);
                        iVar7 = uVar6 + 3;
                        do {
                          if (uVar22 <= uVar23) {
                            uVar14 = -iVar24;
                            local_110 = 0xe;
                            goto LAB_0010e907;
                          }
                          puVar21 = (uint *)((long)&local_138->codes +
                                            (ulong)(uint)(iVar2 + (int)uVar23) * 4);
                          if (uVar23 < local_e0) {
                            puVar21 = puVar17;
                          }
                          *puVar21 = 0;
                          uVar23 = uVar23 + 1;
                          iVar24 = iVar24 + -1;
                          puVar17 = puVar17 + 1;
                          iVar7 = iVar7 + -1;
                        } while (iVar7 != 0);
                      }
                      else {
                        if (uVar6 != 0x10) {
                          uVar6 = 0x10;
                          goto LAB_0010e1c3;
                        }
                        if (uVar14 == 0) {
                          uVar6 = 0x36;
                          goto LAB_0010e1c3;
                        }
                        uVar6 = local_168.buffer & 3;
                        local_168.buffer = local_168.buffer >> 2;
                        local_168.bp = local_168.bp + 2;
                        puVar17 = (uint *)((long)&local_138->codes +
                                          (ulong)((uVar14 - 0x102) + (int)local_f8) * 4);
                        if (uVar14 < local_ec) {
                          puVar17 = (uint *)((long)&local_130->codes + (ulong)(uVar14 - 1) * 4);
                        }
                        uVar12 = *puVar17;
                        uVar23 = (ulong)uVar14;
                        iVar24 = -uVar14;
                        puVar17 = (uint *)((long)&local_130->codes + uVar23 * 4);
                        iVar7 = uVar6 + 3;
                        do {
                          if (uVar22 <= uVar23) {
                            uVar14 = -iVar24;
                            local_110 = 0xd;
                            goto LAB_0010e907;
                          }
                          puVar21 = (uint *)((long)&local_138->codes +
                                            (ulong)(uint)(iVar2 + (int)uVar23) * 4);
                          if (uVar23 < local_e0) {
                            puVar21 = puVar17;
                          }
                          *puVar21 = uVar12;
                          uVar23 = uVar23 + 1;
                          iVar24 = iVar24 + -1;
                          puVar17 = puVar17 + 1;
                          iVar7 = iVar7 + -1;
                        } while (iVar7 != 0);
                      }
                      uVar14 = -iVar24;
                    }
LAB_0010e907:
                    uVar6 = 0x32;
                    if (local_168.bitsize < local_168.bp) goto LAB_0010e1c3;
                    uVar23 = local_168.bp;
                  } while (uVar14 < uVar5);
                  uVar6 = local_110;
                  if (local_110 == 0) {
                    if (*(int *)&local_130[0x19].table_len == 0) {
                      uVar6 = 0x40;
                    }
                    else {
                      uVar6 = HuffmanTree_makeFromLengths(&local_88,(uint *)local_130,0x120,0xf);
                      pHVar15 = local_138;
                      if (uVar6 == 0) {
                        uVar6 = HuffmanTree_makeFromLengths(&local_b8,(uint *)local_138,0x20,0xf);
                      }
                    }
                  }
                }
              }
              else {
                pHVar20 = (HuffmanTree *)0x0;
                pHVar15 = (HuffmanTree *)0x0;
              }
            }
LAB_0010e1c3:
            free(pHVar8);
            free(pHVar20);
            free(pHVar15);
            HuffmanTree_cleanup(&local_58);
            outsize = (size_t *)pHVar8;
            uVar23 = local_168.bp;
          }
        }
LAB_0010e1e8:
        local_168.bp = uVar23;
        puVar3 = local_88.table_len;
        local_120 = local_88.table_value;
        local_130 = (HuffmanTree *)local_b8.table_len;
        local_108 = (HuffmanTree *)local_b8.table_value;
        pHVar8 = local_118;
        do {
          if (uVar6 != 0) goto LAB_0010e596;
          pHVar15 = (HuffmanTree *)(local_168.bp >> 3);
          if ((HuffmanTree *)((long)&pHVar15->codes + 3U) < local_168.size) {
            local_168.buffer = *(uint *)((long)&pHVar15->codes + (long)(uint **)local_168.data);
          }
          else {
            local_168.buffer = 0;
            if (pHVar15 < local_168.size) {
              local_168.buffer =
                   (uint)*(byte *)((long)&pHVar15->codes + (long)(uint **)local_168.data);
            }
            pHVar20 = (HuffmanTree *)((long)&pHVar15->codes + 1);
            if (pHVar20 < local_168.size) {
              local_168.buffer =
                   local_168.buffer |
                   (uint)*(byte *)((long)&pHVar20->codes + (long)(uint **)local_168.data) << 8;
            }
            pHVar15 = (HuffmanTree *)((long)&pHVar15->codes + 2);
            if (pHVar15 < local_168.size) {
              local_168.buffer =
                   local_168.buffer |
                   (uint)*(byte *)((long)&pHVar15->codes + (long)(uint **)local_168.data) << 0x10;
            }
          }
          local_168.buffer = local_168.buffer >> ((byte)local_168.bp & 7);
          outsize = (size_t *)puVar3;
          uVar6 = huffmanDecodeSymbol(&local_168,(HuffmanTree *)puVar3);
          puVar10 = __ptr;
          if (uVar6 < 0x100) {
            pHVar20 = (HuffmanTree *)((long)&pHVar18->codes + 1);
            pHVar16 = pHVar8;
            if (pHVar8 < pHVar20) {
              pHVar16 = (HuffmanTree *)((ulong)((long)pHVar20 * 3) >> 1);
              if ((HuffmanTree *)((long)pHVar8 * 2) < pHVar20) {
                pHVar16 = pHVar20;
              }
              outsize = (size_t *)pHVar16;
              puVar10 = (unsigned_short *)realloc(__ptr,(size_t)pHVar16);
              if (puVar10 == (unsigned_short *)0x0) {
LAB_0010e588:
                local_118 = pHVar8;
                local_140 = pHVar18;
                uVar6 = 0x53;
                pHVar18 = local_140;
                pHVar8 = local_118;
                goto LAB_0010e596;
              }
            }
            *(uchar *)((long)puVar10 + (long)pHVar18) = (uchar)uVar6;
            pHVar15 = (HuffmanTree *)0x1;
            local_128 = pHVar20;
LAB_0010e513:
            pHVar18 = (HuffmanTree *)((long)&pHVar15->codes + (long)&pHVar18->codes);
          }
          else {
            if ((uVar6 == 0x100) || (0x11d < uVar6)) {
              uVar6 = (uint)(uVar6 != 0x100) << 4;
              goto LAB_0010e596;
            }
            uVar23 = (ulong)(uVar6 - 0x101);
            pHVar15 = (HuffmanTree *)(ulong)LENGTHBASE[uVar23];
            if (0xffffffffffffffeb < uVar23 - 0x1c) {
              local_168.bp = local_168.bp + LENGTHEXTRA[uVar23];
              pHVar15 = (HuffmanTree *)
                        ((long)&pHVar15->codes +
                        (ulong)(~(-1 << ((byte)LENGTHEXTRA[uVar23] & 0x1f)) & local_168.buffer));
            }
            pHVar20 = (HuffmanTree *)(local_168.bp >> 3);
            bVar11 = (byte)local_168.bp;
            if ((HuffmanTree *)((long)&pHVar20->codes + 4U) < local_168.size) {
              local_168.buffer =
                   ((uint)*(byte *)((long)((long)(uint **)local_168.data + 4) + (long)pHVar20) <<
                   0x18) << (bVar11 & 7 ^ 7) |
                   *(uint *)((long)&pHVar20->codes + (long)(uint **)local_168.data) >> (bVar11 & 7);
            }
            else {
              local_168.buffer = 0;
              if (pHVar20 < local_168.size) {
                local_168.buffer =
                     (uint)*(byte *)((long)&pHVar20->codes + (long)(uint **)local_168.data);
              }
              pHVar16 = (HuffmanTree *)((long)&pHVar20->codes + 1);
              if (pHVar16 < local_168.size) {
                local_168.buffer =
                     local_168.buffer |
                     (uint)*(byte *)((long)&pHVar16->codes + (long)(uint **)local_168.data) << 8;
              }
              pHVar16 = (HuffmanTree *)((long)&pHVar20->codes + 2);
              if (pHVar16 < local_168.size) {
                local_168.buffer =
                     local_168.buffer |
                     (uint)*(byte *)((long)&pHVar16->codes + (long)(uint **)local_168.data) << 0x10;
              }
              pHVar20 = (HuffmanTree *)((long)&pHVar20->codes + 3);
              if (pHVar20 < local_168.size) {
                local_168.buffer =
                     local_168.buffer |
                     (uint)*(byte *)((long)&pHVar20->codes + (long)(uint **)local_168.data) << 0x18;
              }
              local_168.buffer = local_168.buffer >> (bVar11 & 7);
            }
            outsize = (size_t *)local_130;
            local_140 = pHVar18;
            local_118 = pHVar8;
            uVar6 = huffmanDecodeSymbol(&local_168,local_130);
            pHVar18 = local_140;
            pHVar8 = local_118;
            if (0x1d < uVar6) {
              uVar6 = (uint)(uVar6 < 0x20) * 2 + 0x10;
              goto LAB_0010e596;
            }
            uVar5 = DISTANCEBASE[uVar6];
            if (3 < uVar6) {
              bVar11 = (byte)DISTANCEEXTRA[uVar6];
              uVar14 = ~(-1 << (bVar11 & 0x1f)) & local_168.buffer;
              local_168.buffer = local_168.buffer >> (bVar11 & 0x1f);
              outsize = (size_t *)(ulong)local_168.buffer;
              local_168.bp = local_168.bp + DISTANCEEXTRA[uVar6];
              uVar5 = uVar5 + uVar14;
            }
            pHVar20 = (HuffmanTree *)(ulong)uVar5;
            lVar19 = (long)local_140 - (long)pHVar20;
            if (local_140 < pHVar20) {
              uVar6 = 0x34;
              goto LAB_0010e596;
            }
            local_138 = (HuffmanTree *)((long)&local_140->codes + (long)&pHVar15->codes);
            pHVar16 = local_118;
            if (local_118 < local_138) {
              pHVar16 = (HuffmanTree *)((ulong)((long)local_138 * 3) >> 1);
              if ((HuffmanTree *)((long)local_118 * 2) < local_138) {
                pHVar16 = local_138;
              }
              outsize = (size_t *)pHVar16;
              puVar10 = (unsigned_short *)realloc(__ptr,(size_t)pHVar16);
              pHVar18 = local_140;
              pHVar8 = local_118;
              if (puVar10 == (unsigned_short *)0x0) goto LAB_0010e588;
            }
            pHVar18 = local_140;
            if (pHVar15 <= pHVar20) {
              if (pHVar15 == (HuffmanTree *)0x0) {
                pHVar15 = (HuffmanTree *)0x0;
                local_128 = local_138;
              }
              else {
                outsize = (size_t *)(lVar19 + (long)puVar10);
                memcpy((uchar *)((long)&local_140->codes + (long)puVar10),outsize,(size_t)pHVar15);
                local_128 = local_138;
              }
              goto LAB_0010e513;
            }
            if (pHVar20 != (HuffmanTree *)0x0) {
              outsize = (size_t *)((long)puVar10 + lVar19);
              memcpy((uchar *)((long)&local_140->codes + (long)puVar10),outsize,(size_t)pHVar20);
            }
            lVar26 = (long)&pHVar20->codes + (long)&pHVar18->codes;
            lVar13 = 0;
            do {
              *(uchar *)((long)puVar10 + lVar13 + lVar26) =
                   *(uchar *)((long)puVar10 + lVar13 + lVar19);
              lVar13 = lVar13 + 1;
            } while ((long)pHVar15 - (long)pHVar20 != lVar13);
            pHVar18 = (HuffmanTree *)(lVar26 + lVar13);
            local_128 = local_138;
          }
          uVar6 = 0;
          pHVar8 = pHVar16;
          __ptr = puVar10;
        } while (local_168.bp <= local_168.bitsize);
        uVar6 = 0x33;
LAB_0010e596:
        local_118 = pHVar8;
        local_140 = pHVar18;
        HuffmanTree_cleanup(&local_88);
        HuffmanTree_cleanup(&local_b8);
        uVar5 = local_10c;
      }
      uVar5 = uVar5 & 1;
    } while (uVar6 == 0);
  }
  *local_d0 = (uchar *)__ptr;
  *local_c8 = (ulong)local_128;
  return uVar6;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings) {
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}